

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O2

int __thiscall QPlainTextEditPrivate::init(QPlainTextEditPrivate *this,EVP_PKEY_CTX *ctx)

{
  QWidget *pQVar1;
  QPlainTextEditControl *pQVar2;
  QTextDocument *this_00;
  QPlainTextDocumentLayout *this_01;
  QPalette *pal;
  undefined4 *puVar3;
  QPaintDevice *pQVar4;
  ConnectionType type;
  ConnectionType type_00;
  long in_FS_OFFSET;
  ulong uVar5;
  QObject local_b8 [8];
  undefined1 local_b0 [16];
  undefined1 local_a0 [16];
  undefined1 local_90 [16];
  undefined1 local_80 [16];
  undefined1 local_70 [16];
  undefined1 local_60 [24];
  QCursor local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *(QWidget **)
            &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
             field_0x8;
  pQVar2 = (QPlainTextEditControl *)operator_new(0x28);
  QPlainTextEditControl::QPlainTextEditControl(pQVar2,(QPlainTextEdit *)pQVar1);
  this->control = pQVar2;
  this_00 = (QTextDocument *)operator_new(0x10);
  QTextDocument::QTextDocument(this_00,(QObject *)pQVar2);
  this_01 = (QPlainTextDocumentLayout *)operator_new(0x10);
  QPlainTextDocumentLayout::QPlainTextDocumentLayout(this_01,this_00);
  QTextDocument::setDocumentLayout((QAbstractTextDocumentLayout *)this_00);
  QWidgetTextControl::setDocument((QWidgetTextControl *)this->control,this_00);
  pQVar2 = this->control;
  pal = QWidget::palette(pQVar1);
  QWidgetTextControl::setPalette((QWidgetTextControl *)pQVar2,pal);
  local_48.d = (QCursorData *)verticalScrollbarActionTriggered;
  uStack_40 = 0;
  uVar5 = 0;
  type = (ConnectionType)this;
  QObjectPrivate::connect<void(QAbstractSlider::*)(int),void(QPlainTextEditPrivate::*)(int)>
            ((Object *)(local_60 + 0x10),
             (offset_in_QAbstractSlider_to_subr)(this->super_QAbstractScrollAreaPrivate).vbar,
             (Object *)QAbstractSlider::actionTriggered,0,type);
  QMetaObject::Connection::~Connection((Connection *)(local_60 + 0x10));
  pQVar2 = this->control;
  local_48.d = (QCursorData *)QWidgetTextControl::microFocusChanged;
  uStack_40 = 0;
  puVar3 = (undefined4 *)operator_new(0x18);
  *puVar3 = 1;
  *(code **)(puVar3 + 2) =
       QtPrivate::
       QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/widgets/widgets/qplaintextedit.cpp:753:22),_QtPrivate::List<>,_void>
       ::impl;
  *(QWidget **)(puVar3 + 4) = pQVar1;
  QObject::connectImpl
            ((QObject *)(local_60 + 8),(void **)pQVar2,(QObject *)&local_48,(void **)pQVar1,
             (QSlotObjectBase *)0x0,(ConnectionType)puVar3,(int *)(uVar5 & 0xffffffff00000000),
             (QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)(local_60 + 8));
  local_48.d = (QCursorData *)adjustScrollbars;
  uStack_40 = 0;
  QObjectPrivate::
  connect<void(QWidgetTextControl::*)(QSizeF_const&),void(QPlainTextEditPrivate::*)()>
            ((Object *)local_60,(offset_in_QWidgetTextControl_to_subr)this->control,
             (Object *)QWidgetTextControl::documentSizeChanged,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_60);
  local_48.d = (QCursorData *)QPlainTextEdit::blockCountChanged;
  uStack_40 = 0;
  type_00 = (ConnectionType)pQVar1;
  QObject::connect<void(QWidgetTextControl::*)(int),void(QPlainTextEdit::*)(int)>
            ((Object *)(local_70 + 8),(offset_in_QWidgetTextControl_to_subr)this->control,
             (ContextType *)QWidgetTextControl::blockCountChanged,
             (offset_in_QPlainTextEdit_to_subr *)0x0,type_00);
  QMetaObject::Connection::~Connection((Connection *)(local_70 + 8));
  local_48.d = (QCursorData *)repaintContents;
  uStack_40 = 0;
  QObjectPrivate::
  connect<void(QWidgetTextControl::*)(QRectF_const&),void(QPlainTextEditPrivate::*)(QRectF_const&)>
            ((Object *)local_70,(offset_in_QWidgetTextControl_to_subr)this->control,
             (Object *)QWidgetTextControl::updateRequest,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_70);
  local_48.d = (QCursorData *)QPlainTextEdit::modificationChanged;
  uStack_40 = 0;
  QObject::connect<void(QWidgetTextControl::*)(bool),void(QPlainTextEdit::*)(bool)>
            ((Object *)(local_80 + 8),(offset_in_QWidgetTextControl_to_subr)this->control,
             (ContextType *)QWidgetTextControl::modificationChanged,
             (offset_in_QPlainTextEdit_to_subr *)0x0,type_00);
  QMetaObject::Connection::~Connection((Connection *)(local_80 + 8));
  local_48.d = (QCursorData *)QPlainTextEdit::textChanged;
  uStack_40 = 0;
  QObject::connect<void(QWidgetTextControl::*)(),void(QPlainTextEdit::*)()>
            ((Object *)local_80,(offset_in_QWidgetTextControl_to_subr)this->control,
             (ContextType *)QWidgetTextControl::textChanged,(offset_in_QPlainTextEdit_to_subr *)0x0,
             type_00);
  QMetaObject::Connection::~Connection((Connection *)local_80);
  local_48.d = (QCursorData *)QPlainTextEdit::undoAvailable;
  uStack_40 = 0;
  QObject::connect<void(QWidgetTextControl::*)(bool),void(QPlainTextEdit::*)(bool)>
            ((Object *)(local_90 + 8),(offset_in_QWidgetTextControl_to_subr)this->control,
             (ContextType *)QWidgetTextControl::undoAvailable,
             (offset_in_QPlainTextEdit_to_subr *)0x0,type_00);
  QMetaObject::Connection::~Connection((Connection *)(local_90 + 8));
  local_48.d = (QCursorData *)QPlainTextEdit::redoAvailable;
  uStack_40 = 0;
  QObject::connect<void(QWidgetTextControl::*)(bool),void(QPlainTextEdit::*)(bool)>
            ((Object *)local_90,(offset_in_QWidgetTextControl_to_subr)this->control,
             (ContextType *)QWidgetTextControl::redoAvailable,
             (offset_in_QPlainTextEdit_to_subr *)0x0,type_00);
  QMetaObject::Connection::~Connection((Connection *)local_90);
  local_48.d = (QCursorData *)QPlainTextEdit::copyAvailable;
  uStack_40 = 0;
  QObject::connect<void(QWidgetTextControl::*)(bool),void(QPlainTextEdit::*)(bool)>
            ((Object *)(local_a0 + 8),(offset_in_QWidgetTextControl_to_subr)this->control,
             (ContextType *)QWidgetTextControl::copyAvailable,
             (offset_in_QPlainTextEdit_to_subr *)0x0,type_00);
  QMetaObject::Connection::~Connection((Connection *)(local_a0 + 8));
  local_48.d = (QCursorData *)QPlainTextEdit::selectionChanged;
  uStack_40 = 0;
  QObject::connect<void(QWidgetTextControl::*)(),void(QPlainTextEdit::*)()>
            ((Object *)local_a0,(offset_in_QWidgetTextControl_to_subr)this->control,
             (ContextType *)QWidgetTextControl::selectionChanged,
             (offset_in_QPlainTextEdit_to_subr *)0x0,type_00);
  QMetaObject::Connection::~Connection((Connection *)local_a0);
  local_48.d = (QCursorData *)cursorPositionChanged;
  uStack_40 = 0;
  QObjectPrivate::connect<void(QWidgetTextControl::*)(),void(QPlainTextEditPrivate::*)()>
            ((Object *)(local_b0 + 8),(offset_in_QWidgetTextControl_to_subr)this->control,
             (Object *)QWidgetTextControl::cursorPositionChanged,0,type);
  QMetaObject::Connection::~Connection((Connection *)(local_b0 + 8));
  local_48.d = (QCursorData *)updatePlaceholderVisibility;
  uStack_40 = 0;
  uVar5 = 0;
  QObjectPrivate::connect<void(QWidgetTextControl::*)(),void(QPlainTextEditPrivate::*)()>
            ((Object *)local_b0,(offset_in_QWidgetTextControl_to_subr)this->control,
             (Object *)QWidgetTextControl::textChanged,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_b0);
  pQVar2 = this->control;
  local_48.d = (QCursorData *)QWidgetTextControl::textChanged;
  uStack_40 = 0;
  puVar3 = (undefined4 *)operator_new(0x18);
  *puVar3 = 1;
  *(code **)(puVar3 + 2) =
       QtPrivate::
       QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/widgets/widgets/qplaintextedit.cpp:771:68),_QtPrivate::List<>,_void>
       ::impl;
  *(QWidget **)(puVar3 + 4) = pQVar1;
  QObject::connectImpl
            (local_b8,(void **)pQVar2,(QObject *)&local_48,(void **)pQVar1,(QSlotObjectBase *)0x0,
             (ConnectionType)puVar3,(int *)(uVar5 & 0xffffffff00000000),(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_b8);
  QTextDocument::setTextWidth(-1.0);
  pQVar4 = (QPaintDevice *)QTextDocument::documentLayout();
  QAbstractTextDocumentLayout::setPaintDevice(pQVar4);
  QTextDocument::setDefaultFont((QFont *)this_00);
  if (*(long *)(ctx + 0x10) != 0) {
    QWidgetTextControl::setPlainText((QWidgetTextControl *)this->control,(QString *)ctx);
  }
  QAbstractSlider::setSingleStep
            (&((this->super_QAbstractScrollAreaPrivate).hbar)->super_QAbstractSlider,0x14);
  QAbstractSlider::setSingleStep
            (&((this->super_QAbstractScrollAreaPrivate).vbar)->super_QAbstractSlider,1);
  QWidget::setBackgroundRole((this->super_QAbstractScrollAreaPrivate).viewport,Base);
  QWidget::setAcceptDrops(pQVar1,true);
  QWidget::setFocusPolicy(pQVar1,StrongFocus);
  QWidget::setAttribute(pQVar1,WA_KeyCompression,true);
  QWidget::setAttribute(pQVar1,WA_InputMethodEnabled,true);
  QWidget::setInputMethodHints(pQVar1,(InputMethodHints)0x400);
  pQVar1 = (this->super_QAbstractScrollAreaPrivate).viewport;
  QCursor::QCursor(&local_48,IBeamCursor);
  QWidget::setCursor(pQVar1,&local_48);
  QCursor::~QCursor(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QPlainTextEditPrivate::init(const QString &txt)
{
    Q_Q(QPlainTextEdit);
    control = new QPlainTextEditControl(q);

    QTextDocument *doc = new QTextDocument(control);
    QAbstractTextDocumentLayout *layout = new QPlainTextDocumentLayout(doc);
    doc->setDocumentLayout(layout);
    control->setDocument(doc);

    control->setPalette(q->palette());

    QObjectPrivate::connect(vbar, &QAbstractSlider::actionTriggered,
                            this, &QPlainTextEditPrivate::verticalScrollbarActionTriggered);
    QObject::connect(control, &QWidgetTextControl::microFocusChanged, q,
                     [q](){q->updateMicroFocus(); });
    QObjectPrivate::connect(control, &QWidgetTextControl::documentSizeChanged,
                            this, &QPlainTextEditPrivate::adjustScrollbars);
    QObject::connect(control, &QWidgetTextControl::blockCountChanged,
                     q, &QPlainTextEdit::blockCountChanged);
    QObjectPrivate::connect(control, &QWidgetTextControl::updateRequest,
                            this, &QPlainTextEditPrivate::repaintContents);
    QObject::connect(control, &QWidgetTextControl::modificationChanged,
                     q, &QPlainTextEdit::modificationChanged);
    QObject::connect(control, &QWidgetTextControl::textChanged, q, &QPlainTextEdit::textChanged);
    QObject::connect(control, &QWidgetTextControl::undoAvailable, q, &QPlainTextEdit::undoAvailable);
    QObject::connect(control, &QWidgetTextControl::redoAvailable, q, &QPlainTextEdit::redoAvailable);
    QObject::connect(control, &QWidgetTextControl::copyAvailable, q, &QPlainTextEdit::copyAvailable);
    QObject::connect(control, &QWidgetTextControl::selectionChanged, q, &QPlainTextEdit::selectionChanged);
    QObjectPrivate::connect(control, &QWidgetTextControl::cursorPositionChanged,
                            this, &QPlainTextEditPrivate::cursorPositionChanged);
    QObjectPrivate::connect(control, &QWidgetTextControl::textChanged,
                            this, &QPlainTextEditPrivate::updatePlaceholderVisibility);
    QObject::connect(control, &QWidgetTextControl::textChanged, q, [q](){q->updateMicroFocus(); });

    // set a null page size initially to avoid any relayouting until the textedit
    // is shown. relayoutDocument() will take care of setting the page size to the
    // viewport dimensions later.
    doc->setTextWidth(-1);
    doc->documentLayout()->setPaintDevice(viewport);
    doc->setDefaultFont(q->font());


    if (!txt.isEmpty())
        control->setPlainText(txt);

    hbar->setSingleStep(20);
    vbar->setSingleStep(1);

    viewport->setBackgroundRole(QPalette::Base);
    q->setAcceptDrops(true);
    q->setFocusPolicy(Qt::StrongFocus);
    q->setAttribute(Qt::WA_KeyCompression);
    q->setAttribute(Qt::WA_InputMethodEnabled);
    q->setInputMethodHints(Qt::ImhMultiLine);

#ifndef QT_NO_CURSOR
    viewport->setCursor(Qt::IBeamCursor);
#endif
}